

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

bool __thiscall PClassPlayerPawn::GetPainFlash(PClassPlayerPawn *this,FName *type,PalEntry *color)

{
  Node *pNVar1;
  Node *pNVar2;
  
  do {
    if (this == (PClassPlayerPawn *)0x0) {
LAB_0055757f:
      return this != (PClassPlayerPawn *)0x0;
    }
    pNVar1 = (this->PainFlashes).Nodes + ((this->PainFlashes).Size - 1 & type->Index);
    do {
      pNVar2 = pNVar1;
      if ((pNVar2 == (Node *)0x0) || (pNVar2->Next == (Node *)0x1)) {
        pNVar2 = (Node *)0x0;
        break;
      }
      pNVar1 = pNVar2->Next;
    } while ((pNVar2->Pair).Key.Index != type->Index);
    if (pNVar2 != (Node *)0x0) {
      color->field_0 = (pNVar2->Pair).Value.field_0;
      goto LAB_0055757f;
    }
    this = dyn_cast<PClassPlayerPawn>((DObject *)(this->super_PClassActor).super_PClass.ParentClass)
    ;
  } while( true );
}

Assistant:

bool PClassPlayerPawn::GetPainFlash(FName type, PalEntry *color) const
{
	const PClassPlayerPawn *info = this;

	while (info != NULL)
	{
		const PalEntry *flash = info->PainFlashes.CheckKey(type);
		if (flash != NULL)
		{
			*color = *flash;
			return true;
		}
		// Try parent class
		info = dyn_cast<PClassPlayerPawn>(info->ParentClass);
	}
	return false;
}